

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NetPortHeaderSyntax::setChild
          (NetPortHeaderSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->dataType).ptr = (DataTypeSyntax *)pSVar1;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->netType).kind = TVar2.kind;
    (this->netType).field_0x2 = TVar2._2_1_;
    (this->netType).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->netType).rawLen = TVar2.rawLen;
    (this->netType).info = TVar2.info;
  }
  else {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->direction).kind = TVar2.kind;
    (this->direction).field_0x2 = TVar2._2_1_;
    (this->direction).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->direction).rawLen = TVar2.rawLen;
    (this->direction).info = TVar2.info;
  }
  return;
}

Assistant:

void NetPortHeaderSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: direction = child.token(); return;
        case 1: netType = child.token(); return;
        case 2: dataType = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}